

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoMode.cpp
# Opt level: O3

bool sf::operator<=(VideoMode *left,VideoMode *right)

{
  bool bVar1;
  
  bVar1 = right->bitsPerPixel < left->bitsPerPixel;
  if ((right->bitsPerPixel == left->bitsPerPixel) &&
     (bVar1 = right->width < left->width, right->width == left->width)) {
    bVar1 = right->height < left->height;
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool operator <(const VideoMode& left, const VideoMode& right)
{
    if (left.bitsPerPixel == right.bitsPerPixel)
    {
        if (left.width == right.width)
        {
            return left.height < right.height;
        }
        else
        {
            return left.width < right.width;
        }
    }
    else
    {
        return left.bitsPerPixel < right.bitsPerPixel;
    }
}